

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void SUNDlsMat_denseMatvec
               (sunrealtype **a,sunrealtype *x,sunrealtype *y,sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  if (m < 1) {
    m = lVar2;
  }
  for (; m != lVar2; lVar2 = lVar2 + 1) {
    y[lVar2] = 0.0;
  }
  lVar2 = 0;
  if (n < 1) {
    n = lVar2;
  }
  for (; lVar2 != n; lVar2 = lVar2 + 1) {
    psVar1 = a[lVar2];
    for (lVar3 = 0; m != lVar3; lVar3 = lVar3 + 1) {
      y[lVar3] = psVar1[lVar3] * x[lVar2] + y[lVar3];
    }
  }
  return;
}

Assistant:

void SUNDlsMat_denseMatvec(sunrealtype** a, sunrealtype* x, sunrealtype* y,
                           sunindextype m, sunindextype n)
{
  sunindextype i, j;
  sunrealtype* col_j;

  for (i = 0; i < m; i++) { y[i] = ZERO; }

  for (j = 0; j < n; j++)
  {
    col_j = a[j];
    for (i = 0; i < m; i++) { y[i] += col_j[i] * x[j]; }
  }
}